

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkPrint256(void)

{
  uint local_14;
  FILE *pFStack_10;
  uint i;
  FILE *pFile;
  
  pFStack_10 = fopen("4varfs.txt","w");
  for (local_14 = 1; local_14 < 0xffff; local_14 = local_14 + 1) {
    fprintf(pFStack_10,"read_truth ");
    Extra_PrintBinary((FILE *)pFStack_10,&local_14,0x10);
    fprintf(pFStack_10,"; clp; st; w 1.blif; map; cec 1.blif\n");
  }
  fclose(pFStack_10);
  return;
}

Assistant:

void Abc_NtkPrint256()
{
    FILE * pFile;
    unsigned i;
    pFile = fopen( "4varfs.txt", "w" );
    for ( i = 1; i < (1<<16)-1; i++ )
    {
        fprintf( pFile, "read_truth " );
        Extra_PrintBinary( pFile, &i, 16 );
        fprintf( pFile, "; clp; st; w 1.blif; map; cec 1.blif\n" );
    }
    fclose( pFile );
}